

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_byte_for_non_strings.cpp
# Opt level: O1

int main(void)

{
  ostream *poVar1;
  long lVar2;
  char local_29;
  
  lVar2 = 0;
  do {
    local_29 = (&DAT_00102004)[lVar2];
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_29,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  return 0;
}

Assistant:

int main() {
  std::array<std::byte, 3> bytes = {
    std::byte{ 0x41 },
    std::byte{ 0x41 },
    std::byte{ 0x41 }
  };
  for (auto const & byte : bytes) {
    std::cout << static_cast<unsigned char>(byte) << "\n";
  }
}